

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUISpriteBank::setTexture(CGUISpriteBank *this,u32 index,ITexture *texture)

{
  ITexture *pIVar1;
  pointer ppIVar2;
  ITexture *local_30;
  
  while (ppIVar2 = (this->Textures).m_data.
                   super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        (uint)((ulong)((long)(this->Textures).m_data.
                             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3) <=
        index) {
    local_30 = (ITexture *)0x0;
    core::array<irr::video::ITexture_*>::push_back(&this->Textures,&local_30);
  }
  if (texture != (ITexture *)0x0) {
    *(int *)(texture->_vptr_ITexture[-3] + 8 + (long)&(texture->NamedPath).Path) =
         *(int *)(texture->_vptr_ITexture[-3] + 8 + (long)&(texture->NamedPath).Path) + 1;
  }
  pIVar1 = ppIVar2[index];
  if (pIVar1 != (ITexture *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar1->_vptr_ITexture + (long)pIVar1->_vptr_ITexture[0xfffffffffffffffd]));
    ppIVar2 = (this->Textures).m_data.
              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  ppIVar2[index] = texture;
  return;
}

Assistant:

void CGUISpriteBank::setTexture(u32 index, video::ITexture *texture)
{
	while (index >= Textures.size())
		Textures.push_back(0);

	if (texture)
		texture->grab();

	if (Textures[index])
		Textures[index]->drop();

	Textures[index] = texture;
}